

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O3

ssize_t __thiscall ZlibWriter::write(ZlibWriter *this,int __fd,void *__buf,size_t __n)

{
  pointer *ppuVar1;
  uInt uVar2;
  iterator __position;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  undefined4 in_register_00000034;
  Bytef *__args;
  uint8_t zchunk [16384];
  Bytef local_4038 [16392];
  
  this->zbuf_changed = true;
  (this->z).next_in = (Bytef *)CONCAT44(in_register_00000034,__fd);
  (this->z).avail_in = (uInt)__buf;
  do {
    (this->z).next_out = local_4038;
    (this->z).avail_out = 0x4000;
    uVar3 = deflate(&this->z,0);
    if (1 < uVar3) {
      return (ulong)((uInt)__buf - (this->z).avail_in);
    }
    uVar2 = (this->z).avail_out;
    if (uVar2 != 0x4000) {
      uVar4 = (ulong)(0x4000 - uVar2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                (&this->zbuf,
                 (size_type)
                 ((this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish +
                 (uVar4 - (long)(this->zbuf).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start)));
      lVar5 = uVar4 + (uVar4 == 0);
      __args = local_4038;
      do {
        __position._M_current =
             (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->zbuf,__position,
                     __args);
        }
        else {
          *__position._M_current = *__args;
          ppuVar1 = &(this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        __args = __args + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
  } while ((this->z).avail_in != 0);
  return (ssize_t)__buf;
}

Assistant:

int ZlibWriter::write(const void * buf, size_t size)
{
	int zresult;
	uint8_t zchunk[ZLIB_CHUNK_SIZE];

	zbuf_changed = true;

	z.next_in = (Bytef *) buf;
	z.avail_in = (uInt) size;
	do
	{
		z.next_out = zchunk;
		z.avail_out = ZLIB_CHUNK_SIZE;

		zresult = deflate(&z, Z_NO_FLUSH);
		if (zresult != Z_OK && zresult != Z_STREAM_END)
		{
			return (int) (size - z.avail_in);
		}

		size_t bytes_written = ZLIB_CHUNK_SIZE - z.avail_out;
		if (bytes_written != 0)
		{
			zbuf.reserve(zbuf.size() + bytes_written);
			for (size_t i = 0; i < bytes_written; i++)
			{
				zbuf.push_back(zchunk[i]);
			}
		}
	} while (z.avail_in != 0);

	return (int) size;
}